

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O2

void sei_append_708(sei_t *sei,cea708_t *cea708)

{
  int iVar1;
  sei_message_t *psVar2;
  
  psVar2 = sei_message_new(sei_type_user_data_registered_itu_t_t35,(uint8_t *)0x0,0xff);
  iVar1 = cea708_render(cea708,(uint8_t *)(psVar2 + 1),psVar2->size);
  psVar2->size = (long)iVar1;
  if (sei->head == (sei_message_t *)0x0) {
    sei->head = psVar2;
  }
  else {
    sei->tail->next = psVar2;
  }
  sei->tail = psVar2;
  cea708_init(cea708,sei->timestamp);
  return;
}

Assistant:

void sei_append_708(sei_t* sei, cea708_t* cea708)
{
    sei_message_t* msg = sei_message_new(sei_type_user_data_registered_itu_t_t35, 0, CEA608_MAX_SIZE);
    msg->size = cea708_render(cea708, sei_message_data(msg), sei_message_size(msg));
    sei_message_append(sei, msg);
    cea708_init(cea708, sei->timestamp); // will confgure using HLS compatiable defaults
}